

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codewriter.cpp
# Opt level: O0

bool asmjit::_abi_1_10::CodeWriterUtils::encodeOffset64
               (uint64_t *dst,int64_t offset64,OffsetFormat *format)

{
  uint *puVar1;
  OffsetType OVar2;
  bool bVar3;
  uint32_t uVar4;
  uint uVar5;
  unsigned_long uVar6;
  OffsetFormat *in_RDX;
  uint *in_RSI;
  long *in_RDI;
  uint64_t value;
  uint32_t discardLsb;
  uint32_t bitCount;
  char *in_stack_00000390;
  int in_stack_0000039c;
  char *in_stack_000003a0;
  uint32_t in_stack_ffffffffffffff9c;
  int64_t in_stack_ffffffffffffffa0;
  uint *in_stack_ffffffffffffffb0;
  uint *local_30;
  uint32_t local_28;
  uint local_24;
  OffsetFormat *local_20;
  uint *local_18;
  long *local_10;
  bool local_1;
  
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  local_24 = OffsetFormat::immBitCount(in_RDX);
  local_28 = OffsetFormat::immDiscardLsb(local_20);
  uVar5 = local_24;
  if ((local_24 == 0) || (uVar4 = OffsetFormat::valueSize(local_20), uVar4 << 3 < uVar5)) {
    local_1 = false;
  }
  else {
    OVar2 = OffsetFormat::type(local_20);
    puVar1 = local_18;
    if (OVar2 == kUnsignedOffset) {
      if (local_28 != 0) {
        if (0x20 < local_28) {
          DebugUtils::assertionFailed(in_stack_000003a0,in_stack_0000039c,in_stack_00000390);
        }
        uVar5 = Support::lsbMask<unsigned_int,unsigned_int>(&local_28);
        if (((ulong)puVar1 & (ulong)uVar5) != 0) {
          return false;
        }
        local_18 = (uint *)((ulong)local_18 >> ((byte)local_28 & 0x3f));
      }
      local_30 = local_18;
      uVar6 = Support::lsbMask<unsigned_long,unsigned_int>(in_stack_ffffffffffffffb0);
      local_30 = (uint *)((ulong)local_30 & uVar6);
      if (local_30 != local_18) {
        return false;
      }
    }
    else {
      if (local_28 != 0) {
        if (0x20 < local_28) {
          DebugUtils::assertionFailed(in_stack_000003a0,in_stack_0000039c,in_stack_00000390);
        }
        in_stack_ffffffffffffffb0 = local_18;
        uVar5 = Support::lsbMask<unsigned_int,unsigned_int>(&local_28);
        if (((ulong)in_stack_ffffffffffffffb0 & (ulong)uVar5) != 0) {
          return false;
        }
        local_18 = (uint *)((long)local_18 >> ((byte)local_28 & 0x3f));
      }
      bVar3 = Support::isEncodableOffset64(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
      if (!bVar3) {
        return false;
      }
      local_30 = local_18;
    }
    OVar2 = OffsetFormat::type(local_20);
    if (OVar2 < kAArch64_ADR) {
      uVar6 = Support::lsbMask<unsigned_long,unsigned_int>(in_stack_ffffffffffffffb0);
      uVar4 = OffsetFormat::immBitShift(local_20);
      *local_10 = ((ulong)local_30 & uVar6) << ((byte)uVar4 & 0x3f);
      local_1 = true;
    }
    else {
      local_1 = false;
    }
  }
  return local_1;
}

Assistant:

bool CodeWriterUtils::encodeOffset64(uint64_t* dst, int64_t offset64, const OffsetFormat& format) noexcept {
  uint32_t bitCount = format.immBitCount();
  uint32_t discardLsb = format.immDiscardLsb();

  if (!bitCount || bitCount > format.valueSize() * 8u)
    return false;

  uint64_t value;

  // First handle all unsigned offset types.
  if (format.type() == OffsetType::kUnsignedOffset) {
    if (discardLsb) {
      ASMJIT_ASSERT(discardLsb <= 32);
      if ((offset64 & Support::lsbMask<uint32_t>(discardLsb)) != 0)
        return false;
      offset64 = int64_t(uint64_t(offset64) >> discardLsb);
    }

    value = uint64_t(offset64) & Support::lsbMask<uint64_t>(bitCount);
    if (value != uint64_t(offset64))
      return false;
  }
  else {
    // The rest of OffsetType options are all signed.
    if (discardLsb) {
      ASMJIT_ASSERT(discardLsb <= 32);
      if ((offset64 & Support::lsbMask<uint32_t>(discardLsb)) != 0)
        return false;
      offset64 >>= discardLsb;
    }

    if (!Support::isEncodableOffset64(offset64, bitCount))
      return false;

    value = uint64_t(offset64);
  }

  switch (format.type()) {
    case OffsetType::kSignedOffset:
    case OffsetType::kUnsignedOffset: {
      *dst = (value & Support::lsbMask<uint64_t>(bitCount)) << format.immBitShift();
      return true;
    }

    default:
      return false;
  }
}